

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPSolver.cpp
# Opt level: O1

void __thiscall MDPSolver::Print(MDPSolver *this)

{
  MultiAgentDecisionProcessDiscreteInterface *pMVar1;
  size_t sVar2;
  ulong uVar3;
  long *plVar4;
  ostream *poVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long *local_70;
  long local_68;
  long local_60 [2];
  size_t local_50;
  ulong local_48;
  double local_40;
  size_t local_38;
  
  local_38 = (this->_m_pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  sVar2 = PlanningUnitMADPDiscrete::GetNrStates(&this->_m_pu->super_PlanningUnitMADPDiscrete);
  uVar3 = (**(code **)((long)*(this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"States: ",8);
  local_50 = sVar2;
  if (sVar2 != 0) {
    uVar8 = 1;
    do {
      pMVar1 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
      plVar4 = (long *)(**(code **)((long)*pMVar1 + 0x38))(pMVar1,uVar8 - 1);
      (**(code **)(*plVar4 + 0x18))(&local_70,plVar4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_70,local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      uVar7 = (ulong)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar7 < local_50);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  if (local_38 != 0) {
    local_48 = uVar3;
    if (local_38 == 999999) {
      sVar2 = local_50;
      if (uVar3 != 0) {
        uVar3 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Q(:,",4);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") =\t",4);
          if (sVar2 != 0) {
            uVar7 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              (*this->_vptr_MDPSolver[6])(this,uVar7,uVar3);
              std::ostream::_M_insert<double>(extraout_XMM0_Qa);
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (uVar7 < sVar2);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          pMVar1 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
          plVar4 = (long *)(**(code **)((long)*pMVar1 + 0x80))(pMVar1,uVar3);
          (**(code **)(*plVar4 + 0x20))(&local_70,plVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_70,local_68);
          uVar7 = local_48;
          sVar2 = local_50;
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (uVar3 < uVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Policy: ",8);
      if (sVar2 != 0) {
        uVar3 = 0;
        do {
          pMVar1 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
          plVar4 = (long *)(**(code **)((long)*pMVar1 + 0x38))(pMVar1,uVar3);
          (**(code **)(*plVar4 + 0x18))(&local_70,plVar4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_70,local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"->",2);
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          uVar7 = local_48;
          if (local_48 == 0) {
            uVar10 = 0x7fffffff;
          }
          else {
            uVar10 = 0x7fffffff;
            uVar9 = 0;
            auVar11 = ZEXT816(0xffefffffffffffff);
            do {
              local_40 = auVar11._0_8_;
              (*this->_vptr_MDPSolver[6])(this,uVar3,uVar9);
              auVar12._8_8_ = 0;
              auVar12._0_8_ = local_40;
              auVar11._8_8_ = extraout_XMM0_Qb;
              auVar11._0_8_ = extraout_XMM0_Qa_00;
              auVar11 = vmaxsd_avx(auVar11,auVar12);
              if (local_40 < extraout_XMM0_Qa_00) {
                uVar10 = uVar9;
              }
              uVar9 = (ulong)((int)uVar9 + 1);
            } while (uVar9 < uVar7);
          }
          pMVar1 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
          plVar4 = (long *)(**(code **)((long)*pMVar1 + 0x80))(pMVar1,uVar10);
          (**(code **)(*plVar4 + 0x20))(&local_70,plVar4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_70,local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          sVar2 = local_50;
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (uVar3 < sVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
    }
    else {
      uVar7 = 0;
      do {
        if (uVar3 != 0) {
          local_40 = 0.0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Q(t=",4);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,",:,",3);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,") =\t",4);
            sVar2 = local_50;
            if (local_50 != 0) {
              uVar3 = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                (*this->_vptr_MDPSolver[5])(this,uVar7 & 0xffffffff,uVar3,local_40);
                std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
                uVar3 = (ulong)((int)uVar3 + 1);
              } while (uVar3 < sVar2);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            pMVar1 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
            iVar6 = SUB84(local_40,0);
            plVar4 = (long *)(**(code **)((long)*pMVar1 + 0x80))
                                       (pMVar1,(ulong)local_40 & 0xffffffff);
            (**(code **)(*plVar4 + 0x20))(&local_70,plVar4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_70,local_68);
            if (local_70 != local_60) {
              operator_delete(local_70,local_60[0] + 1);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
            std::ostream::put(-0x50);
            std::ostream::flush();
            local_40 = (double)(ulong)(iVar6 + 1);
            uVar3 = local_48;
          } while ((ulong)local_40 < local_48);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != local_38);
    }
  }
  return;
}

Assistant:

void MDPSolver::Print() const
{
    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();

    cout << "States: ";
    for(Index sI = 0; sI < nrS; sI++)
        cout << _m_pu->GetState(sI)->SoftPrintBrief() << " ";
    cout << endl;
        
    if(horizon!=MAXHORIZON)
    {
        for(size_t t = 0; t!=horizon; t++)
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {            
                cout << "Q(t=" << t << ",:," << jaI << ") =\t";
                for(Index sI = 0; sI < nrS; sI++)
                    cout << " " << GetQ(t,sI,jaI);
                cout << " " << _m_pu->GetJointAction(jaI)->SoftPrintBrief();
                cout << endl;
            }
    }
    else
    {
        for(Index jaI = 0; jaI < nrJA; jaI++)
        {            
            cout << "Q(:," << jaI << ") =\t";
            for(Index sI = 0; sI < nrS; sI++)
                cout << " " << GetQ(sI,jaI);
            cout << " " << _m_pu->GetJointAction(jaI)->SoftPrintBrief();
            cout << endl;
        }
        
        cout << "Policy: ";
        for(Index sI = 0; sI < nrS; sI++)
        {
            cout << _m_pu->GetState(sI)->SoftPrintBrief() << "->";
            double q,v=-DBL_MAX;
            Index aMax=INT_MAX;

            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                q=GetQ(sI,jaI);
                if(q>v)
                {
                    v=q;
                    aMax=jaI;
                }
            }
            cout << _m_pu->GetJointAction(aMax)->SoftPrintBrief() << " ";
        }
        cout << endl;
    }
}